

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STLLoader.cpp
# Opt level: O0

void addFacesToMesh(aiMesh *pMesh)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  ulong *puVar4;
  uint *puVar5;
  aiFace *paVar6;
  ulong uVar7;
  aiFace *local_40;
  uint local_24;
  uint o;
  aiFace *face;
  uint p;
  uint i;
  aiMesh *pMesh_local;
  
  uVar2 = CONCAT44(0,pMesh->mNumFaces);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar2;
  uVar3 = SUB168(auVar1 * ZEXT816(0x10),0);
  uVar7 = uVar3 + 8;
  if (SUB168(auVar1 * ZEXT816(0x10),8) != 0 || 0xfffffffffffffff7 < uVar3) {
    uVar7 = 0xffffffffffffffff;
  }
  puVar4 = (ulong *)operator_new__(uVar7);
  *puVar4 = uVar2;
  paVar6 = (aiFace *)(puVar4 + 1);
  if (uVar2 != 0) {
    local_40 = paVar6;
    do {
      aiFace::aiFace(local_40);
      local_40 = local_40 + 1;
    } while (local_40 != paVar6 + uVar2);
  }
  pMesh->mFaces = paVar6;
  face._0_4_ = 0;
  for (face._4_4_ = 0; face._4_4_ < pMesh->mNumFaces; face._4_4_ = face._4_4_ + 1) {
    paVar6 = pMesh->mFaces + face._4_4_;
    paVar6->mNumIndices = 3;
    puVar5 = (uint *)operator_new__(0xc);
    paVar6->mIndices = puVar5;
    for (local_24 = 0; local_24 < 3; local_24 = local_24 + 1) {
      paVar6->mIndices[local_24] = (uint)face;
      face._0_4_ = (uint)face + 1;
    }
  }
  return;
}

Assistant:

void addFacesToMesh(aiMesh* pMesh)
{
    pMesh->mFaces = new aiFace[pMesh->mNumFaces];
    for (unsigned int i = 0, p = 0; i < pMesh->mNumFaces;++i)    {

        aiFace& face = pMesh->mFaces[i];
        face.mIndices = new unsigned int[face.mNumIndices = 3];
        for (unsigned int o = 0; o < 3;++o,++p) {
            face.mIndices[o] = p;
        }
    }
}